

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

void __thiscall soplex::SPxSteepPR<double>::removedVecs(SPxSteepPR<double> *this,int *perm)

{
  SPxSolverBase<double> *pSVar1;
  pointer pdVar2;
  uint uVar3;
  ulong uVar4;
  
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  if (pSVar1->theType == ENTER) {
    pdVar2 = (pSVar1->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (uint)((ulong)((long)(pSVar1->weights).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar2) >> 3);
    if (0 < (int)uVar3) {
      uVar4 = 0;
      do {
        if (-1 < (long)perm[uVar4]) {
          pdVar2[perm[uVar4]] = pdVar2[uVar4];
        }
        uVar4 = uVar4 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar4);
    }
  }
  VectorBase<double>::reDim(&pSVar1->weights,(pSVar1->thevectors->set).thenum,true);
  return;
}

Assistant:

void SPxSteepPR<R>::removedVecs(const int perm[])
{
   assert(this->thesolver != nullptr);
   VectorBase<R>& weights = this->thesolver->weights;

   if(this->thesolver->type() == SPxSolverBase<R>::ENTER)
   {
      int i;
      int j = weights.dim();

      for(i = 0; i < j; ++i)
      {
         if(perm[i] >= 0)
            weights[perm[i]] = weights[i];
      }
   }

   weights.reDim(this->thesolver->coDim());
}